

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rollback_on_exception.hpp
# Opt level: O2

void __thiscall
so_5::details::rollback_on_exception_details::
rollbacker_t<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/sigman78[P]sobjectizer/so_5/rt/impl/layer_core.cpp:127:4)>
::~rollbacker_t(rollbacker_t<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_sigman78[P]sobjectizer_so_5_rt_impl_layer_core_cpp:127:4)>
                *this)

{
  anon_class_16_2_e88080a6 *paVar1;
  layer_core_t *plVar2;
  pointer ptVar3;
  pointer ptVar4;
  
  if (this->m_commited == false) {
    paVar1 = this->m_action;
    plVar2 = paVar1->this;
    ptVar3 = paVar1->it->_M_current;
    for (ptVar4 = (plVar2->m_default_layers).
                  super__Vector_base<so_5::impl::typed_layer_ref_t,_std::allocator<so_5::impl::typed_layer_ref_t>_>
                  ._M_impl.super__Vector_impl_data._M_start; ptVar4 != ptVar3; ptVar4 = ptVar4 + 1)
    {
      (*((ptVar4->m_layer).super___shared_ptr<so_5::layer_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        _vptr_layer_t[3])();
    }
    ptVar3 = paVar1->it->_M_current;
    for (ptVar4 = (plVar2->m_default_layers).
                  super__Vector_base<so_5::impl::typed_layer_ref_t,_std::allocator<so_5::impl::typed_layer_ref_t>_>
                  ._M_impl.super__Vector_impl_data._M_start; ptVar4 != ptVar3; ptVar4 = ptVar4 + 1)
    {
      (*((ptVar4->m_layer).super___shared_ptr<so_5::layer_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        _vptr_layer_t[4])();
    }
  }
  return;
}

Assistant:

inline ~rollbacker_t() { if( !m_commited ) m_action(); }